

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

String * __thiscall kj::ReadableFile::readAllText(String *__return_storage_ptr__,ReadableFile *this)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  ArrayPtr<const_char> AVar3;
  ArrayPtr<const_char> value;
  String local_90;
  ArrayPtr<unsigned_char> local_68;
  size_t local_58;
  size_t n;
  size_t local_48;
  undefined1 local_19;
  ReadableFile *local_18;
  ReadableFile *this_local;
  String *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ReadableFile *)__return_storage_ptr__;
  (*(this->super_FsNode)._vptr_FsNode[2])(&n);
  heapString(__return_storage_ptr__,local_48);
  local_68 = String::asBytes(__return_storage_ptr__);
  iVar1 = (*(this->super_FsNode)._vptr_FsNode[6])(this,0,local_68.ptr,local_68.size_);
  local_58 = CONCAT44(extraout_var,iVar1);
  sVar2 = String::size(__return_storage_ptr__);
  if (CONCAT44(extraout_var,iVar1) < sVar2) {
    AVar3 = String::slice(__return_storage_ptr__,0,local_58);
    value.ptr = (char *)AVar3.size_;
    value.size_ = (size_t)AVar3.ptr;
    heapString(&local_90,(kj *)AVar3.ptr,value);
    String::operator=(__return_storage_ptr__,&local_90);
    String::~String(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

String ReadableFile::readAllText() const {
  String result = heapString(stat().size);
  size_t n = read(0, result.asBytes());
  if (n < result.size()) {
    // Apparently file was truncated concurrently. Reduce to new size to match.
    result = heapString(result.slice(0, n));
  }
  return result;
}